

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_descriptor_heap_introspection_ssbo(Impl *this)

{
  int iVar1;
  Id IVar2;
  Id sizeId;
  LoggingCallback p_Var3;
  Builder *pBVar4;
  void *pvVar5;
  Builder *this_00;
  char *__ptr;
  byte bVar6;
  uint u;
  size_t sStack_10a0;
  Id local_108c;
  VulkanSRVBinding vulkan_binding;
  char buffer [4096];
  
  get_remapping_stage(this->execution_model);
  vulkan_binding.offset_binding.root_constant_index = 0;
  vulkan_binding.offset_binding.bindless.heap_root_offset = 0;
  vulkan_binding.offset_binding.bindless.use_heap = false;
  vulkan_binding.offset_binding.bindless._5_3_ = 0;
  vulkan_binding.offset_binding.descriptor_type = Identity;
  vulkan_binding.buffer_binding.bindless.use_heap = false;
  vulkan_binding.buffer_binding.bindless._5_3_ = 0;
  vulkan_binding.buffer_binding.descriptor_type = Identity;
  vulkan_binding.offset_binding.descriptor_set = 0;
  vulkan_binding.offset_binding.binding = 0;
  vulkan_binding.buffer_binding.descriptor_set = 0;
  vulkan_binding.buffer_binding.binding = 0;
  vulkan_binding.buffer_binding.root_constant_index = 0;
  vulkan_binding.buffer_binding.bindless.heap_root_offset = 0;
  iVar1 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[2])();
  if ((char)iVar1 == '\0') {
    return false;
  }
  if (vulkan_binding.buffer_binding.descriptor_type < TexelBuffer) {
    if ((this->options).physical_address_descriptor_stride != 0) {
      pBVar4 = builder(this);
      IVar2 = spv::Builder::makeUintType(pBVar4,0x20);
      u = (this->options).physical_address_descriptor_stride;
      if ((this->options).instruction_instrumentation.enabled == true) {
        pBVar4 = builder(this);
        IVar2 = spv::Builder::makeVectorType(pBVar4,IVar2,2);
      }
      else {
        u = u * 2;
      }
      pBVar4 = builder(this);
      this_00 = builder(this);
      sizeId = spv::Builder::makeUintConstant(this_00,u,false);
      IVar2 = spv::Builder::makeArrayType(pBVar4,IVar2,sizeId,0);
      pBVar4 = builder(this);
      spv::Builder::addDecoration
                (pBVar4,IVar2,DecorationArrayStride,
                 (uint)(this->options).instruction_instrumentation.enabled * 4 + 4);
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      local_108c = IVar2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)buffer,
                 &local_108c);
      IVar2 = get_struct_type(this,(Vector<spv::Id> *)buffer,0,"DescriptorHeapRawPayload");
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)buffer
                );
      pBVar4 = builder(this);
      spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationOffset,0);
      pBVar4 = builder(this);
      IVar2 = spv::Builder::makeRuntimeArray(pBVar4,IVar2);
      pBVar4 = builder(this);
      spv::Builder::addDecoration
                (pBVar4,IVar2,DecorationArrayStride,
                 (this->options).physical_address_descriptor_stride << 3);
      bVar6 = (this->options).instruction_instrumentation.type == BufferSynchronizationValidation &
              (this->options).instruction_instrumentation.enabled;
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      local_108c = IVar2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)buffer,
                 &local_108c,&vulkan_binding);
      IVar2 = get_struct_type(this,(Vector<spv::Id> *)buffer,0,"DescriptorHeapRobustnessSSBO");
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)buffer
                );
      pBVar4 = builder(this);
      spv::Builder::addDecoration(pBVar4,IVar2,DecorationBlock,-1);
      pBVar4 = builder(this);
      spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationOffset,0);
      if (bVar6 == 0) {
        pBVar4 = builder(this);
        spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationNonWritable,-1);
        pBVar4 = builder(this);
        spv::Builder::addMemberDecoration(pBVar4,IVar2,0,DecorationNonReadable,-1);
      }
      pBVar4 = builder(this);
      spv::Builder::addMemberName(pBVar4,IVar2,0,"descriptors");
      IVar2 = create_variable(this,StorageClassStorageBuffer,IVar2,"DescriptorHeapRobustness");
      pBVar4 = builder(this);
      spv::Builder::addDecoration
                (pBVar4,IVar2,DecorationDescriptorSet,vulkan_binding.buffer_binding.descriptor_set);
      pBVar4 = builder(this);
      spv::Builder::addDecoration
                (pBVar4,IVar2,DecorationBinding,vulkan_binding.buffer_binding.binding);
      (this->instrumentation).descriptor_heap_introspection_var_id = IVar2;
      if (bVar6 != 0) {
        pBVar4 = builder(this);
        IVar2 = spv::Builder::makeUintType(pBVar4,0x20);
        IVar2 = create_variable(this,StorageClassPrivate,IVar2,"InvocationID");
        (this->instrumentation).invocation_id_var_id = IVar2;
        return true;
      }
      return true;
    }
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: physical_address_descriptor_stride must be set.\n";
      sStack_10a0 = 0x39;
      goto LAB_00114056;
    }
    builtin_strncpy(buffer + 0x20,"de must be set.\n",0x11);
    builtin_strncpy(buffer + 0x10,"_descriptor_stri",0x10);
    builtin_strncpy(buffer,"physical_address",0x10);
  }
  else {
    p_Var3 = get_thread_log_callback();
    if (p_Var3 == (LoggingCallback)0x0) {
      __ptr = "[ERROR]: Dummy SSBO must be an SSBO.\n";
      sStack_10a0 = 0x25;
LAB_00114056:
      fwrite(__ptr,sStack_10a0,1,_stderr);
      fflush(_stderr);
      return false;
    }
    builtin_strncpy(buffer + 0x10,"be an SSBO.\n",0xd);
    builtin_strncpy(buffer,"Dummy SSBO must ",0x10);
  }
  pvVar5 = get_thread_log_callback_userdata();
  (*p_Var3)(pvVar5,Error,buffer);
  return false;
}

Assistant:

bool Converter::Impl::emit_descriptor_heap_introspection_ssbo()
{
	// We need to know the size of the descriptor heap. Rather than passing this
	// through a separate descriptor, we can just query the SSBO size of the
	// side-band SSBO. It is designed to have a size equal to the descriptor heap.
	// Somewhat hacky is that we can ask for a global heap of RTAS, which gets us this descriptor.
	D3DBinding d3d_binding = {
		get_remapping_stage(execution_model), DXIL::ResourceKind::RTAccelerationStructure, 0,
		UINT32_MAX, UINT32_MAX, UINT32_MAX, 0,
	};
	VulkanSRVBinding vulkan_binding = {};

	if (!resource_mapping_iface->remap_srv(d3d_binding, vulkan_binding))
		return false;

	if (vulkan_binding.buffer_binding.descriptor_type != VulkanDescriptorType::SSBO &&
	    vulkan_binding.buffer_binding.descriptor_type != VulkanDescriptorType::Identity)
	{
		LOGE("Dummy SSBO must be an SSBO.\n");
		return false;
	}

	if (options.physical_address_descriptor_stride == 0)
	{
		LOGE("physical_address_descriptor_stride must be set.\n");
		return false;
	}

	spv::Id u32_type = builder().makeUintType(32);
	uint32_t elems = options.physical_address_descriptor_stride;

	if (options.instruction_instrumentation.enabled)
		u32_type = builder().makeVectorType(u32_type, 2);
	else
		elems *= 2;

	spv::Id u32_array_type = builder().makeArrayType(u32_type, builder().makeUintConstant(elems), 0);
	builder().addDecoration(u32_array_type, spv::DecorationArrayStride,
	                        options.instruction_instrumentation.enabled ? 8 : 4);

	spv::Id inner_struct_type = get_struct_type({ u32_array_type }, 0, "DescriptorHeapRawPayload");
	builder().addMemberDecoration(inner_struct_type, 0, spv::DecorationOffset, 0);

	spv::Id inner_struct_array_type = builder().makeRuntimeArray(inner_struct_type);
	builder().addDecoration(inner_struct_array_type, spv::DecorationArrayStride,
	                        8u * options.physical_address_descriptor_stride);

	bool sync_val =
		options.instruction_instrumentation.enabled &&
		options.instruction_instrumentation.type == InstructionInstrumentationType::BufferSynchronizationValidation;

	spv::Id block_type_id = get_struct_type({ inner_struct_array_type }, 0, "DescriptorHeapRobustnessSSBO");
	builder().addDecoration(block_type_id, spv::DecorationBlock);
	builder().addMemberDecoration(block_type_id, 0, spv::DecorationOffset, 0);
	if (!sync_val)
	{
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonWritable);
		builder().addMemberDecoration(block_type_id, 0, spv::DecorationNonReadable);
	}
	builder().addMemberName(block_type_id, 0, "descriptors");
	spv::Id var_id = create_variable(spv::StorageClassStorageBuffer, block_type_id, "DescriptorHeapRobustness");

	builder().addDecoration(var_id, spv::DecorationDescriptorSet, vulkan_binding.buffer_binding.descriptor_set);
	builder().addDecoration(var_id, spv::DecorationBinding, vulkan_binding.buffer_binding.binding);

	// Take OpArrayLength of this variable's first member and we have it.
	instrumentation.descriptor_heap_introspection_var_id = var_id;

	if (sync_val)
	{
		instrumentation.invocation_id_var_id =
			create_variable(spv::StorageClassPrivate, builder().makeUintType(32), "InvocationID");
	}

	return true;
}